

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

PatternPtr __thiscall trieste::detail::Inside<7UL>::custom_rep(Inside<7UL> *this)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long in_RSI;
  PatternPtr PVar7;
  
  if (*(long *)(in_RSI + 8) == 0) {
    peVar6 = (element_type *)operator_new(0x60);
    (peVar6->continuation).
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar6->_vptr_PatternDef = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cbeb8;
    peVar6[1]._vptr_PatternDef = (_func_int **)0x0;
    peVar6[1].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (peVar6->continuation).
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__PatternDef_002cbf08;
    pp_Var1 = *(_func_int ***)(in_RSI + 0x20);
    peVar2 = *(element_type **)(in_RSI + 0x28);
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x30);
    pp_Var4 = *(_func_int ***)(in_RSI + 0x38);
    peVar5 = *(element_type **)(in_RSI + 0x40);
    peVar6[1].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x18);
    peVar6[2]._vptr_PatternDef = pp_Var1;
    peVar6[2].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    peVar6[2].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    peVar6[3]._vptr_PatternDef = pp_Var4;
    peVar6[3].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    in_RDX._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x48);
    peVar6[3].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    (this->super_PatternDef)._vptr_PatternDef =
         (_func_int **)
         &(peVar6->continuation).
          super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  }
  else {
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)0x0;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  PVar7.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  PVar7.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_PatternDef;
  return (PatternPtr)
         PVar7.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PatternPtr custom_rep() override
      {
        // Rep(Inside) -> InsideStar
        if (no_continuation())
          return std::make_shared<InsideStar<N>>(types);
        return {};
      }